

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_DeadReckoningParameter.cpp
# Opt level: O0

KDataStream * __thiscall
KDIS::DATA_TYPE::LE_DeadReckoningParameter::Encode
          (KDataStream *__return_storage_ptr__,LE_DeadReckoningParameter *this)

{
  LE_DeadReckoningParameter *this_local;
  KDataStream *stream;
  
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  Encode(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream LE_DeadReckoningParameter::Encode() const
{
    KDataStream stream;

    LE_DeadReckoningParameter::Encode( stream );

    return stream;
}